

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_netinfo.cpp
# Opt level: O2

FString D_EscapeUserInfo(char *str)

{
  FString *this;
  char tail;
  char *in_RSI;
  
  str[0] = -0x14;
  str[1] = -0x22;
  str[2] = 'q';
  str[3] = '\0';
  str[4] = '\0';
  str[5] = '\0';
  str[6] = '\0';
  str[7] = '\0';
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  do {
    tail = *in_RSI;
    if (tail == '%') {
      this = FString::operator+=((FString *)str,'%');
      tail = '%';
    }
    else if (tail == '\\') {
      this = FString::operator+=((FString *)str,'%');
      tail = '/';
    }
    else {
      this = (FString *)str;
      if (tail == '\0') {
        return (FString)str;
      }
    }
    FString::operator+=(this,tail);
    in_RSI = in_RSI + 1;
  } while( true );
}

Assistant:

FString D_EscapeUserInfo (const char *str)
{
	FString ret;

	for (; *str != '\0'; ++str)
	{
		if (*str == '\\')
		{
			ret << '%' << '/';
		}
		else if (*str == '%')
		{
			ret << '%' << '%';
		}
		else
		{
			ret << *str;
		}
	}
	return ret;
}